

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void counting_callback_fn(char *str,void *data)

{
  uint uVar1;
  int32_t *p;
  undefined8 in_R9;
  
  uVar1 = *data;
  if (uVar1 != 0x7fffffff) {
    *(uint *)data = uVar1 + 1;
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x56,"test condition failed: *p != INT32_MAX",in_R9,(ulong)uVar1);
  abort();
}

Assistant:

static void counting_callback_fn(const char* str, void* data) {
    /* Dummy callback function that just counts. */
    int32_t *p;
    (void)str;
    p = data;
    CHECK(*p != INT32_MAX);
    (*p)++;
}